

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImTextureID_resize(ImVector_ImTextureID *self,int new_size)

{
  int new_size_local;
  ImVector_ImTextureID *self_local;
  
  ImVector<void_*>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImTextureID_resize(ImVector_ImTextureID* self,int new_size)
{
    return self->resize(new_size);
}